

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osstzprs.c
# Opt level: O3

char * parse_dst_rule(os_tzrule_t *rule,char *p,size_t *len)

{
  uint uVar1;
  ulong uVar2;
  ushort **ppuVar3;
  char *pcVar4;
  byte bVar5;
  
  uVar2 = *len;
  if (uVar2 < 2) {
    if (uVar2 == 0) {
      return p;
    }
    bVar5 = *p;
  }
  else {
    bVar5 = *p;
    if (((bVar5 | 0x20) == 0x6a) &&
       (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)p[1] * 2 + 1) & 8) != 0)) {
      *len = uVar2 - 1;
      pcVar4 = parse_digits(&rule->jday,p + 1,len);
      goto LAB_001ed37f;
    }
  }
  ppuVar3 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar3 + (long)(char)bVar5 * 2 + 1) & 8) == 0) {
    if (bVar5 != 0x4d || uVar2 < 2) {
      return p;
    }
    if ((*(byte *)((long)*ppuVar3 + (long)p[1] * 2 + 1) & 8) == 0) {
      return p;
    }
    *len = uVar2 - 1;
    pcVar4 = parse_digits(&rule->month,p + 1,len);
    if (rule->month - 0xdU < 0xfffffff4) {
      return p;
    }
    if (*len < 2) {
      return p;
    }
    if (*pcVar4 != '.') {
      return p;
    }
    if ((*(byte *)((long)*ppuVar3 + (long)pcVar4[1] * 2 + 1) & 8) == 0) {
      return p;
    }
    *len = *len - 1;
    pcVar4 = parse_digits(&rule->week,pcVar4 + 1,len);
    if (rule->week - 6U < 0xfffffffb) {
      return p;
    }
    if (*len < 2) {
      return p;
    }
    if (*pcVar4 != '.') {
      return p;
    }
    if ((*(byte *)((long)*ppuVar3 + (long)pcVar4[1] * 2 + 1) & 8) == 0) {
      return p;
    }
    *len = *len - 1;
    pcVar4 = parse_digits(&rule->day,pcVar4 + 1,len);
    uVar1 = rule->day;
    rule->day = uVar1 + 1;
    if (6 < uVar1) {
      return p;
    }
  }
  else {
    pcVar4 = parse_digits(&rule->yday,p,len);
    rule->yday = rule->yday + 1;
  }
LAB_001ed37f:
  uVar2 = *len;
  if (((1 < uVar2) && (*pcVar4 == '/')) &&
     (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)pcVar4[1] * 2 + 1) & 8) != 0)) {
    *len = uVar2 - 1;
    pcVar4 = parse_offset(&rule->time,pcVar4 + 1,len);
    return pcVar4;
  }
  rule->time = 0x1c20;
  return pcVar4;
}

Assistant:

static const char *parse_dst_rule(struct os_tzrule_t *rule,
                                  const char *p, size_t *len)
{
    /* remember the starting point - we'll return this on failure */
    const char *start = p;

    /* check the date portion */
    if (*len >= 2 && (*p == 'J' || *p == 'j') && isdigit(p[1]))
    {
        /* Julian day, not counting February 29 */
        ++p, --*len;
        p = parse_digits(&rule->jday, p, len);
    }
    else if (*len >= 1 && isdigit(*p))
    {
        /* day of year, counting February 29 */
        p = parse_digits(&rule->yday, p, len);

        /* TZ uses range 0-365 for this format, but yday uses 1-366 */
        rule->yday += 1;
    }
    else if (*len >= 2 && *p == 'M' && isdigit(p[1]))
    {
        /* month.week.day format - start with the month */
        ++p, --*len;
        p = parse_digits(&rule->month, p, len);
        if (rule->month < 1 || rule->month > 12)
            return start;

        /* check for the required '.' and a following digit */
        if (*len < 2 || *p != '.' || !isdigit(p[1]))
            return start;

        /* parse the week */
        ++p, --*len;
        p = parse_digits(&rule->week, p, len);
        if (rule->week < 1 || rule->week > 5)
            return start;
        
        /* check for the required '.' and a following digit */
        if (*len < 2 || *p != '.' || !isdigit(p[1]))
            return start;
        
        /* parse the day of the week; adjust from 0-6 to our 1-7 range */
        ++p, --*len;
        p = parse_digits(&rule->day, p, len);
        rule->day += 1;
        if (rule->day < 1 || rule->day > 7)
            return start;
    }
    else
    {
        /* not a valid DST start/end format */
        return p;
    }

    /* we got the date; check for a time portion */
    if (*len >= 2 && *p == '/' && isdigit(p[1]))
    {
        /* parse the time; this has the same parsing rules as an offset */
        ++p, --*len;
        p = parse_offset(&rule->time, p, len);
    }
    else
    {
        /* the default is 2:00 AM */
        rule->time = 2*60*60;
    }

    /* success - return the updated pointer */
    return p;
}